

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_interface.cc
# Opt level: O2

void __thiscall
sentencepiece::ModelInterface::ModelInterface(ModelInterface *this,ModelProto *model_proto)

{
  this->_vptr_ModelInterface = (_func_int **)&PTR__ModelInterface_003b75a8;
  this->model_proto_ = model_proto;
  (this->matcher_)._M_t.
  super___uniq_ptr_impl<sentencepiece::normalizer::PrefixMatcher,_std::default_delete<sentencepiece::normalizer::PrefixMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_sentencepiece::normalizer::PrefixMatcher_*,_std::default_delete<sentencepiece::normalizer::PrefixMatcher>_>
  .super__Head_base<0UL,_sentencepiece::normalizer::PrefixMatcher_*,_false>._M_head_impl =
       (PrefixMatcher *)0x0;
  (this->pieces_)._M_h._M_buckets = &(this->pieces_)._M_h._M_single_bucket;
  (this->pieces_)._M_h._M_bucket_count = 1;
  (this->pieces_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pieces_)._M_h._M_element_count = 0;
  (this->pieces_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pieces_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pieces_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->reserved_id_map_)._M_h._M_buckets = &(this->reserved_id_map_)._M_h._M_single_bucket;
  (this->reserved_id_map_)._M_h._M_bucket_count = 1;
  (this->reserved_id_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->reserved_id_map_)._M_h._M_element_count = 0;
  (this->reserved_id_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->reserved_id_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->reserved_id_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->unk_id_ = 0;
  util::Status::Status(&this->status_);
  return;
}

Assistant:

ModelInterface::ModelInterface(const ModelProto &model_proto)
    : model_proto_(&model_proto), status_(util::OkStatus()) {}